

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O1

void __thiscall
ktx::CommandCreate::determineTargetColorSpace
          (CommandCreate *this,ImageInput *in,ImageSpec *target,ColorSpaceInfo *colorSpaceInfo)

{
  char cVar1;
  khr_df_primaries_e kVar2;
  ColorPrimaries *pCVar3;
  ColorPrimaries *pCVar4;
  ColorPrimaries *in_RAX;
  _Head_base<0UL,_const_TransferFunction_*,_false> _Var5;
  undefined **ppuVar6;
  _Head_base<0UL,_const_TransferFunction_*,_false> _Var7;
  ColorPrimaries *local_28;
  
  local_28 = in_RAX;
  determineSourceColorSpace(this,in,&colorSpaceInfo->src);
  kVar2 = (colorSpaceInfo->src).usedPrimaries;
  if ((this->options).super_OptionsCreate.convertPrimaries.
      super__Optional_base<_khr_df_primaries_e,_true,_true>._M_payload.
      super__Optional_payload_base<_khr_df_primaries_e>._M_engaged == true) {
    if (kVar2 == KHR_DF_PRIMARIES_UNSPECIFIED) {
      __assert_fail("colorSpaceInfo.src.usedPrimaries != KHR_DF_PRIMARIES_UNSPECIFIED && \"determineSourceColorSpace failed to check for UNSPECIFIED.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_create.cpp"
                    ,0xad5,
                    "void ktx::CommandCreate::determineTargetColorSpace(const ImageInput &, ImageSpec &, ColorSpaceInfo &)"
                   );
    }
    (target->formatDesc).basic.field_0x1 =
         *(undefined1 *)
          &(this->options).super_OptionsCreate.convertPrimaries.
           super__Optional_base<_khr_df_primaries_e,_true,_true>._M_payload.
           super__Optional_payload_base<_khr_df_primaries_e>._M_payload;
    createColorPrimaries((CommandCreate *)&stack0xffffffffffffffd8,(khr_df_primaries_e)in);
    pCVar4 = local_28;
    local_28 = (ColorPrimaries *)0x0;
    pCVar3 = (colorSpaceInfo->dst).colorPrimaries._M_t.
             super___uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>
             .super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl;
    (colorSpaceInfo->dst).colorPrimaries._M_t.
    super___uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>._M_t.
    super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
    super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl = pCVar4;
    if (pCVar3 != (ColorPrimaries *)0x0) {
      operator_delete(pCVar3,0x48);
    }
  }
  else {
    (target->formatDesc).basic.field_0x1 = (char)kVar2;
  }
  if ((this->options).super_OptionsCreate.assignTF.
      super__Optional_base<_khr_df_transfer_e,_true,_true>._M_payload.
      super__Optional_payload_base<_khr_df_transfer_e>._M_engaged == true) {
    FormatDescriptor::setTransfer
              (&target->formatDesc,
               (this->options).super_OptionsCreate.assignTF.
               super__Optional_base<_khr_df_transfer_e,_true,_true>._M_payload.
               super__Optional_payload_base<_khr_df_transfer_e>._M_payload._M_value);
  }
  if ((this->options).super_OptionsCreate.convertTF.
      super__Optional_base<_khr_df_transfer_e,_true,_true>._M_payload.
      super__Optional_payload_base<_khr_df_transfer_e>._M_engaged == true) {
    FormatDescriptor::setTransfer
              (&target->formatDesc,
               (this->options).super_OptionsCreate.convertTF.
               super__Optional_base<_khr_df_transfer_e,_true,_true>._M_payload.
               super__Optional_payload_base<_khr_df_transfer_e>._M_payload._M_value);
  }
  cVar1 = (target->formatDesc).basic.field_0x2;
  if (cVar1 == '\x02') {
    _Var5._M_head_impl = (TransferFunction *)operator_new(8);
    ppuVar6 = &PTR_encode_0025f8d0;
  }
  else {
    if (cVar1 != '\x01') {
      _Var7._M_head_impl =
           (colorSpaceInfo->dst).transferFunction._M_t.
           super___uniq_ptr_impl<const_TransferFunction,_std::default_delete<const_TransferFunction>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_TransferFunction_*,_std::default_delete<const_TransferFunction>_>
           .super__Head_base<0UL,_const_TransferFunction_*,_false>._M_head_impl;
      (colorSpaceInfo->dst).transferFunction._M_t.
      super___uniq_ptr_impl<const_TransferFunction,_std::default_delete<const_TransferFunction>_>.
      _M_t.
      super__Tuple_impl<0UL,_const_TransferFunction_*,_std::default_delete<const_TransferFunction>_>
      .super__Head_base<0UL,_const_TransferFunction_*,_false>._M_head_impl = (TransferFunction *)0x0
      ;
      goto LAB_0015ad09;
    }
    _Var5._M_head_impl = (TransferFunction *)operator_new(8);
    ppuVar6 = &PTR_encode_0025f928;
  }
  (_Var5._M_head_impl)->_vptr_TransferFunction = (_func_int **)ppuVar6;
  _Var7._M_head_impl =
       (colorSpaceInfo->dst).transferFunction._M_t.
       super___uniq_ptr_impl<const_TransferFunction,_std::default_delete<const_TransferFunction>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_TransferFunction_*,_std::default_delete<const_TransferFunction>_>
       .super__Head_base<0UL,_const_TransferFunction_*,_false>._M_head_impl;
  (colorSpaceInfo->dst).transferFunction._M_t.
  super___uniq_ptr_impl<const_TransferFunction,_std::default_delete<const_TransferFunction>_>._M_t.
  super__Tuple_impl<0UL,_const_TransferFunction_*,_std::default_delete<const_TransferFunction>_>.
  super__Head_base<0UL,_const_TransferFunction_*,_false>._M_head_impl = _Var5._M_head_impl;
LAB_0015ad09:
  if (_Var7._M_head_impl != (TransferFunction *)0x0) {
    (*(_Var7._M_head_impl)->_vptr_TransferFunction[3])();
    return;
  }
  return;
}

Assistant:

void CommandCreate::determineTargetColorSpace(const ImageInput& in, ImageSpec& target, ColorSpaceInfo& colorSpaceInfo) {
    // Primaries handling:
    //
    // 1. Use assign-primaries option value, if set.
    // 2. Use primaries info given by plugin.
    // 3. If no primaries info and input is PNG use PNG spec.
    //    recommendation of BT709/sRGB otherwise leave as
    //    UNSPECIFIED.
    // 4. If convert-primaries is specified but no primaries info is
    //    given by the plugin then fail.
    // 5. If convert-primaries is specified and primaries info determined
    //    above is different then set up conversion.

    determineSourceColorSpace(in, colorSpaceInfo.src);

    // Set Primaries

    // If convert-primaries is specified and primaries info determined
    // above is different then set up conversion.
    if (options.convertPrimaries.has_value()) {
        assert(colorSpaceInfo.src.usedPrimaries != KHR_DF_PRIMARIES_UNSPECIFIED
               && "determineSourceColorSpace failed to check for UNSPECIFIED.");
        target.format().setPrimaries(options.convertPrimaries.value());
        // Okay to set this even if no conversion needed.
        colorSpaceInfo.dst.colorPrimaries = createColorPrimaries(target.format().primaries());
    } else {
        target.format().setPrimaries(colorSpaceInfo.src.usedPrimaries);
    }

    // target transfer is set from the --format value or --assignTF or --convertTF.
    if (options.assignTF.has_value())
        target.format().setTransfer(options.assignTF.value());

    if (options.convertTF.has_value())
        target.format().setTransfer(options.convertTF.value());

    switch (target.format().transfer()) {
    case KHR_DF_TRANSFER_LINEAR:
        colorSpaceInfo.dst.transferFunction = std::make_unique<TransferFunctionLinear>();
        break;
    case KHR_DF_TRANSFER_SRGB:
        colorSpaceInfo.dst.transferFunction = std::make_unique<TransferFunctionSRGB>();
        break;
    default:
        // Lack of will be handled if color transformation attempted.
        colorSpaceInfo.dst.transferFunction = nullptr;
    }
}